

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O1

void __thiscall
testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  TestPartResultReporterInterface *pTVar1;
  TestPartResultReporterInterface **ppTVar2;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00176db8;
  UnitTest::GetInstance();
  pTVar1 = this->original_reporter_;
  ppTVar2 = ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&(UnitTest::GetInstance::instance.impl_)->
                        per_thread_test_part_result_reporter_);
  *ppTVar2 = pTVar1;
  return;
}

Assistant:

HasNewFatalFailureHelper::~HasNewFatalFailureHelper() {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(
      original_reporter_);
}